

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                 (UnknownFieldSet *unknown_fields)

{
  int iVar1;
  pointer pUVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pUVar2 = (unknown_fields->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (ulong)((long)(unknown_fields->fields_).
                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) >> 4;
  uVar10 = 0;
  uVar9 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar9 = uVar10;
  }
  sVar7 = 0;
  for (; uVar9 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
    switch(*(undefined4 *)((long)&pUVar2->type_ + uVar10)) {
    case 0:
      uVar5 = *(int *)((long)&pUVar2->number_ + uVar10) * 8 + 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar8 = *(ulong *)((long)&pUVar2->data_ + uVar10) | 1;
      lVar3 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar7 = ((int)lVar3 * 9 + 0x49U >> 6) + sVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      break;
    case 1:
      uVar5 = *(int *)((long)&pUVar2->number_ + uVar10) * 8 + 5;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar1 * 9 + 0x49U >> 6) + 4;
      break;
    case 2:
      uVar5 = *(int *)((long)&pUVar2->number_ + uVar10) * 8 + 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar1 * 9 + 0x49U >> 6) + 8;
      break;
    case 3:
      uVar5 = *(int *)((long)&pUVar2->number_ + uVar10) * 8 + 3;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      lVar3 = *(long *)(*(long *)((long)&pUVar2->data_ + uVar10) + 8);
      uVar5 = (uint)lVar3 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar7 = sVar7 + lVar3 + (ulong)(iVar1 * 9 + 0x49U >> 6) + (ulong)(iVar4 * 9 + 0x49U >> 6);
      break;
    case 4:
      iVar1 = *(int *)((long)&pUVar2->number_ + uVar10);
      uVar5 = iVar1 * 8 + 3;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar6 = ComputeUnknownFieldsSize(*(UnknownFieldSet **)((long)&pUVar2->data_ + uVar10));
      uVar5 = iVar1 * 8 + 5;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar6 + sVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6) + (ulong)(iVar1 * 9 + 0x49U >> 6);
    }
  }
  return sVar7;
}

Assistant:

size_t WireFormat::ComputeUnknownFieldsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_VARINT));
        size += io::CodedOutputStream::VarintSize64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED32));
        size += sizeof(int32);
        break;
      case UnknownField::TYPE_FIXED64:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED64));
        size += sizeof(int64);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        size += io::CodedOutputStream::VarintSize32(
            field.length_delimited().size());
        size += field.length_delimited().size();
        break;
      case UnknownField::TYPE_GROUP:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP));
        size += ComputeUnknownFieldsSize(field.group());
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }

  return size;
}